

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Contains.hpp
# Opt level: O3

bool linq::Contains<linq::ConcatState<linq::IEnumerable<int>,linq::IEnumerable<int>,int>,int>
               (ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int> *source,int *item)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  
  (**((source->source1).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->_vptr_IState)();
  (**((source->source2).state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
     _M_ptr)->_vptr_IState)();
  uVar1 = (*((source->source1).state.
             super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_vptr_IState
            [1])();
  source->s1 = SUB41(uVar1,0);
  while( true ) {
    lVar3 = 0x18;
    if ((uVar1 & 1) == 0) {
      iVar2 = (*((source->source2).state.
                 super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                _vptr_IState[1])();
      if ((char)iVar2 == '\0') {
        return false;
      }
      lVar3 = 0x18;
      if ((source->s1 & 1U) == 0) {
        lVar3 = 0x30;
      }
    }
    iVar2 = (**(code **)(**(long **)((long)&(source->super_IState<int>)._vptr_IState + lVar3) + 0x18
                        ))();
    if (iVar2 == *item) break;
    ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>::Advance(source);
    uVar1 = (uint)source->s1;
  }
  return true;
}

Assistant:

bool Contains(S&& source, const T& item)
	{
		for(source.Init() ; source.Valid() ; source.Advance())
			if(source.Current() == item)
				return true;

		return false;
	}